

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

int meatmetal(monst *mtmp)

{
  obj *obj;
  bool bVar1;
  boolean bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  permonst *ptr;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  if (mtmp->mtame != '\0') {
    return 0;
  }
  obj = level->objects[mtmp->mx][mtmp->my];
  do {
    if (obj == (obj *)0x0) {
      return 0;
    }
    if ((((mtmp->data != mons + 0xd9) ||
         ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xb0)) &&
        ((ushort)((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)) &&
       ((bVar2 = obj_resists(obj,5,0x5f), bVar2 == '\0' &&
        (iVar4 = touch_artifact(obj,mtmp), iVar4 != 0)))) {
      if ((mtmp->data != mons + 0xd9) || ((obj->field_0x4b & 0x10) == 0)) {
        if ((obj->otyp == 0xb4) || (obj->otyp == 0xcb)) goto LAB_001e75a9;
        if ((flags.verbose != '\0' & (byte)viz_array[mtmp->my][mtmp->mx] >> 1) == 1) {
          pcVar7 = Monnam(mtmp);
          pcVar8 = distant_name(obj,doname);
          pline("%s eats %s!",pcVar7,pcVar8);
        }
        else if (flags.soundok != '\0' && flags.verbose != '\0') {
          You_hear("a crunching sound.");
        }
        mtmp->meating = (obj->owt >> 1) + 1;
        iVar4 = mtmp->mhpmax;
        if (mtmp->mhp < iVar4) {
          iVar5 = mtmp->mhp + (uint)objects[obj->otyp].oc_weight;
          if (iVar4 <= iVar5) {
            iVar5 = iVar4;
          }
          mtmp->mhp = iVar5;
        }
        if (obj == uball) {
          unpunish();
          delobj(obj);
          goto LAB_001e7ab0;
        }
        if (obj == uchain) {
          unpunish();
          goto LAB_001e7ab0;
        }
        uVar10 = 0;
        uVar6 = (ushort)obj->otyp - 0x10e;
        if ((uVar6 < 0x1c) && ((0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
          uVar9 = obj->corpsenm - 0x117;
          if (uVar9 < 0x3f) {
            uVar10 = 0x4002000000000001 >> ((byte)uVar9 & 0x3f);
          }
          else {
            uVar10 = 0;
          }
        }
        bVar11 = false;
        if ((uVar6 < 0x1c) && ((0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
          bVar11 = obj->corpsenm == 0xec;
        }
        bVar12 = false;
        if ((uVar6 < 0x1c) && (bVar12 = false, (0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
          bVar12 = obj->corpsenm == 0x119;
        }
        bVar1 = false;
        if ((uVar6 < 0x1c) && (bVar1 = false, (0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
          bVar1 = true;
          if ((1 < obj->corpsenm - 0xbU) && (obj->corpsenm != 0x127)) {
            bVar1 = false;
          }
        }
        delobj(obj);
        ptr = mtmp->data;
        if ((uVar10 & 1) == 0) {
          if (bVar11) {
            ptr = grow_up(mtmp,(monst *)0x0);
          }
          else {
            if (bVar1) {
              bVar2 = poly_when_stoned(ptr);
              if (bVar2 != '\0') {
                mon_to_stone(mtmp);
                goto LAB_001e7a8d;
              }
              if ((mtmp->mintrinsics & 0x80) != 0) goto LAB_001e7aa7;
              if (mtmp->wormno == '\0') {
                if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e7ba6;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e7b9d;
                  }
                  else {
LAB_001e7b9d:
                    if (ublindf == (obj *)0x0) goto LAB_001e7c85;
LAB_001e7ba6:
                    if (ublindf->oartifact != '\x1d') goto LAB_001e7c85;
                  }
                  if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                       (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                      ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) ||
                     ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_001e7c85;
                }
              }
              else {
                bVar2 = worm_known(level,mtmp);
                if (bVar2 == '\0') goto LAB_001e7c85;
              }
              uVar6 = *(uint *)&mtmp->field_0x60;
              if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar6 & 0x280) != 0) goto LAB_001e7c85;
              }
              else if (((uVar6 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
              goto LAB_001e7c85;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar7 = Monnam(mtmp);
                pline("%s turns to stone!",pcVar7);
              }
LAB_001e7c85:
              monstone(mtmp);
              return 2;
            }
            if (bVar12) {
              mtmp->mhp = mtmp->mhpmax;
            }
          }
        }
        else {
          iVar4 = newcham(level,mtmp,(permonst *)0x0,'\0','\0');
          if (iVar4 != 0) {
LAB_001e7a8d:
            ptr = mtmp->data;
          }
        }
LAB_001e7aa7:
        if (ptr == (permonst *)0x0) {
          return 2;
        }
LAB_001e7ab0:
        uVar6 = mt_random();
        if (uVar6 % 0x19 < 2) {
          mksobj_at(0x213,level,(int)mtmp->mx,(int)mtmp->my,'\x01','\0');
        }
        newsym((int)mtmp->mx,(int)mtmp->my);
        return 1;
      }
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001e76b1;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e764d;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e7644;
LAB_001e7676:
          if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) {
            bVar3 = viz_array[mtmp->my][mtmp->mx] & 1;
            goto joined_r0x001e769c;
          }
        }
        else {
LAB_001e7644:
          if (ublindf != (obj *)0x0) {
LAB_001e764d:
            if (ublindf->oartifact == '\x1d') goto LAB_001e7676;
          }
        }
      }
      else {
        bVar3 = worm_known(level,mtmp);
joined_r0x001e769c:
        if (bVar3 != 0) {
LAB_001e76b1:
          uVar6 = *(uint *)&mtmp->field_0x60;
          if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar6 & 0x280) == 0) goto LAB_001e76f1;
          }
          else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001e76f1:
            if (((u._1052_1_ & 0x20) == 0) && (flags.verbose != '\0')) {
              pcVar7 = Monnam(mtmp);
              pcVar8 = distant_name(obj,doname);
              pline("%s eats %s!",pcVar7,pcVar8);
            }
          }
        }
      }
      obj->field_0x4b = obj->field_0x4b & 0xef;
      uVar6 = *(uint *)&mtmp->field_0x60 | 0x100000;
      *(uint *)&mtmp->field_0x60 = uVar6;
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e77b6;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e77ad;
          }
          else {
LAB_001e77ad:
            if (ublindf == (obj *)0x0) goto LAB_001e75a9;
LAB_001e77b6:
            if (ublindf->oartifact != '\x1d') goto LAB_001e75a9;
          }
          if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) ||
              ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) || ((mtmp->data->mflags3 & 0x200) == 0))
          goto LAB_001e75a9;
        }
      }
      else {
        bVar2 = worm_known(level,mtmp);
        if (bVar2 == '\0') goto LAB_001e75a9;
        uVar6 = *(uint *)&mtmp->field_0x60;
      }
      if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar6 & 0x280) == 0) goto LAB_001e7868;
      }
      else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001e7868:
        if (((u._1052_1_ & 0x20) == 0) && (flags.verbose != '\0')) {
          pcVar7 = Monnam(mtmp);
          pcVar8 = distant_name(obj,doname);
          pline("%s spits %s out in disgust!",pcVar7,pcVar8);
        }
      }
    }
LAB_001e75a9:
    obj = (obj->v).v_nexthere;
  } while( true );
}

Assistant:

int meatmetal(struct monst *mtmp)
{
	struct obj *otmp;
	const struct permonst *ptr;
	int poly, grow, heal, mstone;

	/* If a pet, eating is handled separately, in dog.c */
	if (mtmp->mtame) return 0;

	/* Eats topmost metal object if it is there */
	for (otmp = level->objects[mtmp->mx][mtmp->my];
						otmp; otmp = otmp->nexthere) {
	    if (mtmp->data == &mons[PM_RUST_MONSTER] && !is_rustprone(otmp))
		continue;
	    if (is_metallic(otmp) && !obj_resists(otmp, 5, 95) &&
		touch_artifact(otmp,mtmp)) {
		if (mtmp->data == &mons[PM_RUST_MONSTER] && otmp->oerodeproof) {
		    if (canseemon(level, mtmp) && flags.verbose) {
			pline("%s eats %s!",
				Monnam(mtmp),
				distant_name(otmp,doname));
		    }
		    /* The object's rustproofing is gone now */
		    otmp->oerodeproof = 0;
		    mtmp->mstun = 1;
		    if (canseemon(level, mtmp) && flags.verbose) {
			pline("%s spits %s out in disgust!",
			      Monnam(mtmp), distant_name(otmp,doname));
		    }
		/* KMH -- Don't eat indigestible/choking objects */
		} else if (otmp->otyp != AMULET_OF_STRANGULATION &&
				otmp->otyp != RIN_SLOW_DIGESTION) {
		    if (cansee(mtmp->mx,mtmp->my) && flags.verbose)
			pline("%s eats %s!", Monnam(mtmp),
				distant_name(otmp,doname));
		    else if (flags.soundok && flags.verbose)
			You_hear("a crunching sound.");
		    mtmp->meating = otmp->owt/2 + 1;
		    /* Heal up to the object's weight in hp */
		    if (mtmp->mhp < mtmp->mhpmax) {
			mtmp->mhp += objects[otmp->otyp].oc_weight;
			if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;
		    }
		    if (otmp == uball) {
			unpunish();
			delobj(otmp);
		    } else if (otmp == uchain) {
			unpunish();	/* frees uchain */
		    } else {
			poly = polyfodder(otmp);
			grow = mlevelgain(otmp);
			heal = mhealup(otmp);
			mstone = mstoning(otmp);
			delobj(otmp);
			ptr = mtmp->data;
			if (poly) {
			    if (newcham(level, mtmp, NULL,
					FALSE, FALSE))
				ptr = mtmp->data;
			} else if (grow) {
			    ptr = grow_up(mtmp, NULL);
			} else if (mstone) {
			    if (poly_when_stoned(ptr)) {
				mon_to_stone(mtmp);
				ptr = mtmp->data;
			    } else if (!resists_ston(mtmp)) {
				if (canseemon(level, mtmp))
				    pline("%s turns to stone!", Monnam(mtmp));
				monstone(mtmp);
				ptr = NULL;
			    }
			} else if (heal) {
			    mtmp->mhp = mtmp->mhpmax;
			}
			if (!ptr) return 2;		 /* it died */
		    }
		    /* Left behind a pile? */
		    if (rnd(25) < 3)
			mksobj_at(ROCK, level, mtmp->mx, mtmp->my, TRUE, FALSE);
		    newsym(mtmp->mx, mtmp->my);
		    return 1;
		}
	    }
	}
	return 0;
}